

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end.c
# Opt level: O1

void done_in_by(monst *mtmp)

{
  char cVar1;
  permonst *ppVar2;
  int iVar3;
  char buf [256];
  char acStack_118 [264];
  
  killer_format = done_in_by_format(mtmp,acStack_118);
  ppVar2 = mtmp->data;
  cVar1 = ppVar2->mlet;
  iVar3 = 0xec;
  if (cVar1 != '1') {
    if (urace.mummynum == -1 || cVar1 != '\'') {
      if ((((cVar1 != '0') && ((ppVar2->mflags2 & 0x100) == 0)) ||
          (iVar3 = 0xe8, urace.malenum != 0x10b)) && (iVar3 = u.ugrave_arise, ppVar2 == mons + 0xfd)
         ) {
        iVar3 = 0xfd;
      }
    }
    else {
      iVar3 = (int)urace.mummynum;
    }
  }
  u.ugrave_arise = iVar3;
  if ((-1 < (long)u.ugrave_arise) && ((mvitals[u.ugrave_arise].mvflags & 2) != 0)) {
    u.ugrave_arise = -1;
  }
  killer = acStack_118;
  pline("You die...");
  done((uint)(mtmp->data == mons + 0xb || mtmp->data == mons + 0xc) << 3);
  return;
}

Assistant:

void done_in_by(const struct monst *mtmp)
{
	char buf[BUFSZ];
	killer_format = done_in_by_format(mtmp, buf);
	killer = buf;

	if (mtmp->data->mlet == S_WRAITH)
		u.ugrave_arise = PM_WRAITH;
	else if (mtmp->data->mlet == S_MUMMY && urace.mummynum != NON_PM)
		u.ugrave_arise = urace.mummynum;
	else if (is_vampire(mtmp->data) && Race_if (PM_HUMAN))
		u.ugrave_arise = PM_VAMPIRE;
	else if (mtmp->data == &mons[PM_GHOUL])
		u.ugrave_arise = PM_GHOUL;
	if (u.ugrave_arise >= LOW_PM &&
				(mvitals[u.ugrave_arise].mvflags & G_GENOD))
		u.ugrave_arise = NON_PM;

	pline("You die...");
	if (touch_petrifies(mtmp->data))
		done(STONING);
	else
		done(DIED);
}